

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcWallType::~IfcWallType(IfcWallType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x8ceda0;
  *(undefined8 *)&this->field_0x30 = 0x8ceeb8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8cedc8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8cedf0;
  *(undefined8 *)&this[-1].field_0x138 = 0x8cee18;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8cee40;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x8cee68;
  *(undefined8 *)this = 0x8cee90;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x8cf180;
  *(undefined8 *)&this->field_0x30 = 0x8cf248;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8cf1a8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8cf1d0;
  *(undefined8 *)&this[-1].field_0x138 = 0x8cf1f8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8cf220;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__008ceee0);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcWallType() : Object("IfcWallType") {}